

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ImplicitWeakMessage::New(ImplicitWeakMessage *this,Arena *arena)

{
  MessageLite *pMVar1;
  
  if (arena == (Arena *)0x0) {
    pMVar1 = (MessageLite *)operator_new(0x30);
    arena = (Arena *)0x0;
  }
  else {
    Arena::AllocHook(arena,(type_info *)&typeinfo,0x30);
    pMVar1 = (MessageLite *)
             ArenaImpl::AllocateAlignedAndAddCleanup
                       (&arena->impl_,0x30,
                        arena_destruct_object<google::protobuf::internal::ImplicitWeakMessage>);
  }
  (pMVar1->_internal_metadata_).ptr_ = arena;
  pMVar1->_vptr_MessageLite = (_func_int **)&PTR__ImplicitWeakMessage_003deb38;
  pMVar1[1]._vptr_MessageLite = (_func_int **)(pMVar1 + 2);
  pMVar1[1]._internal_metadata_.ptr_ = (void *)0x0;
  *(undefined1 *)&pMVar1[2]._vptr_MessageLite = 0;
  return pMVar1;
}

Assistant:

MessageLite* New(Arena* arena) const override {
    return Arena::CreateMessage<ImplicitWeakMessage>(arena);
  }